

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O2

shared_ptr<const_Assimp::FBX::PropertyTable> __thiscall
Assimp::FBX::Util::GetPropertyTable
          (Util *this,Document *doc,string *templateName,Element *element,Scope *sc,bool no_warn)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Element *__args_1;
  const_iterator cVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FBX::PropertyTable> sVar3;
  shared_ptr<const_Assimp::FBX::PropertyTable> templateProps;
  allocator<char> local_61;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Properties70",(allocator<char> *)&local_60);
  __args_1 = Scope::operator[](sc,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_ptr<Assimp::FBX::PropertyTable_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::FBX::PropertyTable_const,void>
            ((__shared_ptr<Assimp::FBX::PropertyTable_const,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (PropertyTable *)0x0);
  if (templateName->_M_string_length != 0) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
            ::find(&(doc->templates)._M_t,templateName);
    if ((_Rb_tree_header *)cVar2._M_node != &(doc->templates)._M_t._M_impl.super__Rb_tree_header) {
      std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_60,
                 (__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *)
                 (cVar2._M_node + 2));
    }
  }
  if ((__args_1 == (Element *)0x0) ||
     ((__args_1->compound)._M_t.
      super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
      super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
      super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl == (Scope *)0x0)) {
    if (!no_warn) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"property table (Properties70) not found",&local_61);
      DOMWarning(&local_50,element);
      std::__cxx11::string::~string((string *)&local_50);
    }
    _Var1._M_pi = local_60._M_refcount._M_pi;
    if (local_60._M_ptr == (element_type *)0x0) {
      std::make_shared<Assimp::FBX::PropertyTable_const>();
    }
    else {
      *(element_type **)this = local_60._M_ptr;
      local_60._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
      local_60._M_ptr = (element_type *)0x0;
    }
  }
  else {
    std::
    make_shared<Assimp::FBX::PropertyTable_const,Assimp::FBX::Element_const&,std::shared_ptr<Assimp::FBX::PropertyTable_const>&>
              ((Element *)this,(shared_ptr<const_Assimp::FBX::PropertyTable> *)__args_1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  sVar3.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FBX::PropertyTable>)
         sVar3.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const PropertyTable> GetPropertyTable(const Document& doc,
    const std::string& templateName,
    const Element &element,
    const Scope& sc,
    bool no_warn /*= false*/)
{
    const Element* const Properties70 = sc["Properties70"];
    std::shared_ptr<const PropertyTable> templateProps = std::shared_ptr<const PropertyTable>(
        static_cast<const PropertyTable*>(NULL));

    if(templateName.length()) {
        PropertyTemplateMap::const_iterator it = doc.Templates().find(templateName);
        if(it != doc.Templates().end()) {
            templateProps = (*it).second;
        }
    }

    if(!Properties70 || !Properties70->Compound()) {
        if(!no_warn) {
            DOMWarning("property table (Properties70) not found",&element);
        }
        if(templateProps) {
            return templateProps;
        }
        else {
            return std::make_shared<const PropertyTable>();
        }
    }
    return std::make_shared<const PropertyTable>(*Properties70,templateProps);
}